

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.h
# Opt level: O2

color_rgba __thiscall
basisu::etc_block::get_block_color(etc_block *this,uint32_t subblock_index,bool scaled)

{
  uint16_t uVar1;
  uint16_t packed_delta3;
  undefined8 in_RAX;
  color_rgba b;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_24;
  
  local_24 = SUB84((ulong)in_RAX >> 0x20,0);
  if (((this->field_0).m_bytes[3] & 2) == 0) {
    uVar1 = get_base4_color(this,subblock_index);
    local_24.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
         unpack_color4(uVar1,scaled,0xff);
  }
  else {
    uVar1 = get_base5_color(this);
    if (subblock_index == 0) {
      unpack_color5((color_rgba *)&local_24.field_1,uVar1,scaled);
    }
    else {
      packed_delta3 = get_delta3_color(this);
      unpack_color5((color_rgba *)&local_24.field_1,uVar1,packed_delta3,scaled,0xff);
    }
  }
  return (anon_union_4_2_6eba8969_for_color_rgba_0)
         (anon_union_4_2_6eba8969_for_color_rgba_0)local_24.field_1;
}

Assistant:

color_rgba get_block_color(uint32_t subblock_index, bool scaled) const
		{
			color_rgba b;

			if (get_diff_bit())
			{
				if (subblock_index)
					unpack_color5(b, get_base5_color(), get_delta3_color(), scaled);
				else
					unpack_color5(b, get_base5_color(), scaled);
			}
			else
			{
				b = unpack_color4(get_base4_color(subblock_index), scaled);
			}

			return b;
		}